

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void anon_unknown.dwarf_11e01b::doReadWriteManifest(IDManifest *mfst,string *fn,bool dump)

{
  byte bVar1;
  int iVar2;
  ostream *out;
  Header *mfst_00;
  ostream *poVar3;
  Header *pHVar4;
  CompressedIDManifest *pCVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  byte in_DL;
  IDManifest *in_RDI;
  vector<char,_std::allocator<char>_> compressed;
  size_t compressedDataSize;
  size_t sourceDataSize;
  ostringstream str;
  IDManifest read;
  CompressedIDManifest *cmpd;
  InputFile in;
  Header h;
  InputFile *in_stack_fffffffffffffc80;
  allocator_type *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  string local_2c8 [39];
  allocator<char> local_2a1 [25];
  ulong local_288;
  string local_280 [8];
  string *in_stack_fffffffffffffd88;
  Header *in_stack_fffffffffffffd90;
  string local_258 [32];
  ostringstream local_238 [376];
  IDManifest local_c0;
  int *local_a8;
  InputFile local_a0 [48];
  CompressedIDManifest local_70 [24];
  Vec2<float> local_58;
  Header local_50 [63];
  byte local_11;
  IDManifest *local_8;
  
  local_11 = in_DL & 1;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_58,0.0,0.0);
  Imf_3_4::Header::Header(local_50,0x40,0x40,1.0,(Vec2 *)&local_58,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::CompressedIDManifest::CompressedIDManifest(local_70,local_8);
  Imf_3_4::addIDManifest(local_50,local_70);
  Imf_3_4::CompressedIDManifest::~CompressedIDManifest(local_70);
  writeFile(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  out = (ostream *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_a0,(char *)out,iVar2);
  mfst_00 = (Header *)Imf_3_4::InputFile::header();
  local_a8 = (int *)Imf_3_4::idManifest(mfst_00);
  poVar3 = std::operator<<((ostream *)&std::cerr,"compression: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_a8 + 2));
  poVar3 = std::operator<<(poVar3," --> ");
  std::ostream::operator<<(poVar3,*local_a8);
  std::ostream::flush();
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  pCVar5 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar4);
  Imf_3_4::IDManifest::IDManifest(&local_c0,pCVar5);
  std::__cxx11::ostringstream::ostringstream(local_238);
  operator<<(out,(IDManifest *)mfst_00);
  poVar3 = std::operator<<((ostream *)&std::cerr," raw decoded size: ");
  std::__cxx11::ostringstream::str();
  uVar6 = std::__cxx11::string::size();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6);
  std::operator<<(poVar3,' ');
  std::__cxx11::string::~string(local_258);
  std::__cxx11::ostringstream::str();
  uVar7 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_280);
  local_288 = exr_compress_max_buffer_size(uVar7);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  std::allocator<char>::~allocator(local_2a1);
  std::__cxx11::ostringstream::str();
  uVar8 = std::__cxx11::string::c_str();
  pcVar9 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1a55c0);
  exr_compress_buffer(0,4,uVar8,uVar7,pcVar9,local_288,&local_288);
  std::__cxx11::string::~string(local_2c8);
  poVar3 = std::operator<<((ostream *)&std::cerr,"simple zip size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_288);
  std::operator<<(poVar3,' ');
  std::ostream::flush();
  if ((local_11 & 1) != 0) {
    operator<<(out,(IDManifest *)mfst_00);
  }
  bVar1 = Imf_3_4::IDManifest::operator!=(&local_c0,local_8);
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"read manifest didn\'t match written manifest\n");
  }
  pcVar9 = (char *)std::__cxx11::string::c_str();
  remove(pcVar9);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar3);
  std::__cxx11::ostringstream::~ostringstream(local_238);
  Imf_3_4::IDManifest::~IDManifest((IDManifest *)0x1a5808);
  Imf_3_4::InputFile::~InputFile(in_stack_fffffffffffffc80);
  Imf_3_4::Header::~Header(local_50);
  return;
}

Assistant:

void
doReadWriteManifest (const IDManifest& mfst, const string& fn, bool dump)
{
    Header h;
    addIDManifest (h, mfst);
    writeFile (h, fn);

    InputFile in (fn.c_str ());

    const CompressedIDManifest& cmpd = idManifest (in.header ());
    cerr << "compression: " << cmpd._uncompressedDataSize << " --> "
         << cmpd._compressedDataSize;
    cerr.flush ();

    IDManifest read = idManifest (in.header ());

    std::ostringstream str;
    str << read;

    cerr << " raw decoded size: " << str.str ().size () << ' ';

#define COMPARE_WITH_SIMPLE_ZIP
#ifdef COMPARE_WITH_SIMPLE_ZIP
    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t sourceDataSize     = str.str ().size ();
    size_t compressedDataSize = exr_compress_max_buffer_size (sourceDataSize);
    vector<char> compressed (compressedDataSize);

    exr_compress_buffer (
        nullptr,
        4,
        str.str ().c_str (),
        sourceDataSize,
        compressed.data (),
        compressedDataSize,
        &compressedDataSize);

    cerr << "simple zip size: " << compressedDataSize << ' ';
#endif

    cerr.flush ();
    if (dump) { cout << read; }
    if (read != mfst)
    {
        cerr << "read manifest didn't match written manifest\n";
        assert (read == mfst);
    }
    remove (fn.c_str ());
}